

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O3

bool crnlib::image_utils::write_to_file
               (char *pFilename,image_u8 *img,uint write_flags,int grayscale_comp_index)

{
  uchar uVar1;
  uint uVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  elemental_vector *peVar8;
  void *pData;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  color_quad<unsigned_char,_int> *pcVar12;
  ulong uVar13;
  uchar *puVar14;
  undefined2 *puVar15;
  long lVar16;
  code *pcVar17;
  ulong uVar18;
  uint min_new_capacity;
  undefined7 uVar19;
  vector<unsigned_char> temp;
  size_t png_image_size;
  dynamic_string ext;
  elemental_vector local_68;
  params local_58;
  dynamic_string local_48;
  uint local_34;
  
  if (grayscale_comp_index - 4U < 0xfffffffb) {
    return false;
  }
  if (img->m_width == 0) {
    return false;
  }
  dynamic_string::dynamic_string(&local_48,pFilename);
  bVar4 = file_utils::get_extension(&local_48);
  if (bVar4) {
    iVar5 = dynamic_string::compare(&local_48,"jpg",false);
    uVar19 = (undefined7)((ulong)&local_48 >> 8);
    if (iVar5 == 0) {
      uVar11 = (uint)CONCAT71(uVar19,1);
    }
    else {
      iVar5 = dynamic_string::compare(&local_48,"jpeg",false);
      uVar11 = (uint)CONCAT71(uVar19,iVar5 == 0);
    }
    iVar5 = dynamic_string::compare(&local_48,"png",false);
    if (((iVar5 != 0) && (iVar5 = dynamic_string::compare(&local_48,"bmp",false), iVar5 != 0)) &&
       (iVar5 = dynamic_string::compare(&local_48,"tga",false), iVar5 != 0 && (char)uVar11 == '\0'))
    {
      bVar4 = false;
      console::error(
                    "crnlib::image_utils::write_to_file: Can only write .BMP, .TGA, .PNG, or .JPG files!\n"
                    );
      goto LAB_00119276;
    }
    local_68.m_p = (void *)0x0;
    local_68.m_size = 0;
    local_68.m_capacity = 0;
    write_flags = write_flags | uVar11 & 0xff;
  }
  else {
    local_68.m_p = (void *)0x0;
    local_68.m_size = 0;
    local_68.m_capacity = 0;
    uVar11 = 0;
  }
  local_68.m_size = 0;
  local_68.m_capacity = 0;
  local_68.m_p = (void *)0x0;
  local_34 = uVar11;
  if ((write_flags & 2) == 0 && (img->m_comp_flags & 0x10) == 0) {
    if (((write_flags & 1) == 0 & (byte)((img->m_comp_flags & 8) >> 3)) == 0) {
      uVar11 = img->m_height;
      uVar9 = img->m_width * uVar11 * 3;
      if (uVar9 != 0) {
        elemental_vector::increase_capacity(&local_68,uVar9,uVar9 == 1,1,(object_mover)0x0,false);
        memset((void *)((long)local_68.m_p + (local_68._8_8_ & 0xffffffff)),0,
               (ulong)(uVar9 - local_68.m_size));
        uVar11 = img->m_height;
        local_68.m_size = uVar9;
      }
      iVar5 = 3;
      peVar8 = &local_68;
      if (uVar11 != 0) {
        uVar10 = 0;
        do {
          uVar2 = img->m_width;
          if ((ulong)uVar2 != 0) {
            pcVar12 = img->m_pPixels + img->m_pitch * uVar10;
            pcVar3 = pcVar12 + uVar2;
            puVar15 = (undefined2 *)((long)local_68.m_p + (ulong)(uVar2 * uVar10 * 3));
            do {
              uVar1 = (pcVar12->field_0).field_0.b;
              *puVar15 = *(undefined2 *)&pcVar12->field_0;
              *(uchar *)(puVar15 + 1) = uVar1;
              puVar15 = (undefined2 *)((long)puVar15 + 3);
              pcVar12 = pcVar12 + 1;
            } while (pcVar12 != pcVar3);
            uVar11 = img->m_height;
          }
          uVar10 = uVar10 + 1;
          peVar8 = &local_68;
        } while (uVar10 < uVar11);
      }
    }
    else {
      iVar5 = 4;
      peVar8 = (elemental_vector *)&img->m_pPixels;
    }
  }
  else {
    uVar9 = img->m_height;
    min_new_capacity = img->m_width * uVar9;
    if (min_new_capacity != 0) {
      elemental_vector::increase_capacity
                (&local_68,min_new_capacity,min_new_capacity == 1,1,(object_mover)0x0,false);
      memset((void *)((long)local_68.m_p + (local_68._8_8_ & 0xffffffff)),0,
             (ulong)(min_new_capacity - local_68.m_size));
      uVar9 = img->m_height;
      local_68.m_size = min_new_capacity;
    }
    iVar5 = 1;
    peVar8 = &local_68;
    if (uVar9 != 0) {
      uVar11 = 0;
      do {
        pcVar3 = img->m_pPixels;
        uVar10 = img->m_width;
        uVar13 = (ulong)uVar10;
        uVar18 = (ulong)(img->m_pitch * uVar11);
        puVar14 = (uchar *)((long)local_68.m_p + (ulong)(uVar10 * uVar11));
        if ((img->m_comp_flags & 0x10) == 0) {
          if (grayscale_comp_index < 0) {
            if (uVar13 != 0) {
              lVar16 = 0;
              do {
                pcVar12 = pcVar3 + uVar18 + lVar16;
                *(char *)((long)local_68.m_p + lVar16 + (ulong)(uVar10 * uVar11)) =
                     (char)((uint)(pcVar12->field_0).field_0.b * 0x1d2f +
                            (uint)(pcVar12->field_0).field_0.g * 0x9646 +
                            (uint)(pcVar12->field_0).field_0.r * 0x4c8b + 0x8000 >> 0x10);
                lVar16 = lVar16 + 1;
              } while (pcVar12 + 1 != pcVar3 + uVar18 + uVar13);
            }
          }
          else if (uVar13 != 0) {
            lVar16 = 0;
            do {
              *puVar14 = pcVar3[uVar18].field_0.c[lVar16 + (ulong)(uint)grayscale_comp_index];
              puVar14 = puVar14 + 1;
              lVar16 = lVar16 + 4;
            } while (uVar13 << 2 != lVar16);
          }
        }
        else if (uVar13 != 0) {
          lVar16 = 0;
          do {
            *puVar14 = pcVar3[uVar18].field_0.c[lVar16 + 1];
            puVar14 = puVar14 + 1;
            lVar16 = lVar16 + 4;
          } while (uVar13 << 2 != lVar16);
        }
        uVar11 = uVar11 + 1;
        peVar8 = &local_68;
      } while (uVar11 < img->m_height);
    }
  }
  pcVar3 = *(color_quad<unsigned_char,_int> **)peVar8;
  iVar6 = dynamic_string::compare(&local_48,"png",false);
  if (iVar6 == 0) {
    local_58.m_quality = 0;
    local_58.m_subsampling = Y_ONLY;
    pData = tdefl_write_image_to_png_file_in_memory
                      (pcVar3,img->m_width,img->m_height,iVar5,(size_t *)&local_58);
    if (pData == (void *)0x0) {
      bVar4 = false;
    }
    else {
      bVar4 = file_utils::write_buf_to_file(pFilename,pData,local_58._0_8_);
      mz_free(pData);
    }
    bVar4 = (bool)(pData != (void *)0x0 & bVar4);
  }
  else if ((char)local_34 == '\0') {
    iVar6 = dynamic_string::compare(&local_48,"bmp",false);
    pcVar17 = stbi_write_tga;
    if (iVar6 == 0) {
      pcVar17 = stbi_write_bmp;
    }
    iVar5 = (*pcVar17)(pFilename,img->m_width,img->m_height,iVar5,pcVar3);
    bVar4 = iVar5 == 1;
  }
  else {
    local_58.m_quality = 0x55;
    local_58.m_subsampling = H2V2;
    local_58.m_use_std_tables = false;
    if (0xffffff < write_flags) {
      local_58.m_quality = 100;
      if (write_flags >> 0x18 < 100) {
        local_58.m_quality = write_flags >> 0x18;
      }
      local_58.m_subsampling = 3;
    }
    local_58.m_two_pass_flag = (bool)((byte)(write_flags >> 0x13) & 1);
    local_58.m_no_chroma_discrim_flag = (bool)((byte)(write_flags >> 0x14) & 1);
    uVar7 = 1;
    if ((((write_flags >> 0x10 & 1) != 0) || (uVar7 = 2, (write_flags >> 0x11 & 1) != 0)) ||
       (uVar7 = 3, (write_flags >> 0x12 & 1) != 0)) {
      local_58.m_subsampling = uVar7;
    }
    bVar4 = jpge::compress_image_to_jpeg_file
                      (pFilename,img->m_width,img->m_height,iVar5,(uint8 *)pcVar3,&local_58);
  }
  if (local_68.m_p != (void *)0x0) {
    crnlib_free(local_68.m_p);
  }
LAB_00119276:
  if ((local_48.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_48.m_pStr + -8) ^ *(uint *)(local_48.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_48.m_pStr + -0x10);
  }
  return bVar4;
}

Assistant:

bool write_to_file(const char* pFilename, const image_u8& img, uint write_flags, int grayscale_comp_index)
        {
            if ((grayscale_comp_index < -1) || (grayscale_comp_index > 3))
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            if (!img.get_width())
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            dynamic_string ext(pFilename);
            bool is_jpeg = false;
            if (file_utils::get_extension(ext))
            {
                is_jpeg = ((ext == "jpg") || (ext == "jpeg"));

                if ((ext != "png") && (ext != "bmp") && (ext != "tga") && (!is_jpeg))
                {
                    console::error("crnlib::image_utils::write_to_file: Can only write .BMP, .TGA, .PNG, or .JPG files!\n");
                    return false;
                }
            }

            crnlib::vector<uint8> temp;
            uint num_src_chans = 0;
            const void* pSrc_img = nullptr;

            if (is_jpeg)
            {
                write_flags |= cWriteFlagIgnoreAlpha;
            }

            if ((img.get_comp_flags() & pixel_format_helpers::cCompFlagGrayscale) || (write_flags & image_utils::cWriteFlagGrayscale))
            {
                CRNLIB_ASSERT(grayscale_comp_index < 4);
                if (grayscale_comp_index > 3)
                {
                    grayscale_comp_index = 3;
                }

                temp.resize(img.get_total_pixels());

                for (uint y = 0; y < img.get_height(); y++)
                {
                    const color_quad_u8* pSrc = img.get_scanline(y);
                    const color_quad_u8* pSrc_end = pSrc + img.get_width();
                    uint8* pDst = &temp[y * img.get_width()];

                    if (img.get_comp_flags() & pixel_format_helpers::cCompFlagGrayscale)
                    {
                        while (pSrc != pSrc_end)
                        {
                            *pDst++ = (*pSrc++)[1];
                        }
                    }
                    else if (grayscale_comp_index < 0)
                    {
                        while (pSrc != pSrc_end)
                        {
                            *pDst++ = static_cast<uint8>((*pSrc++).get_luma());
                        }
                    }
                    else
                    {
                        while (pSrc != pSrc_end)
                        {
                            *pDst++ = (*pSrc++)[grayscale_comp_index];
                        }
                    }
                }

                pSrc_img = &temp[0];
                num_src_chans = 1;
            }
            else if ((!img.is_component_valid(3)) || (write_flags & cWriteFlagIgnoreAlpha))
            {
                temp.resize(img.get_total_pixels() * 3);

                for (uint y = 0; y < img.get_height(); y++)
                {
                    const color_quad_u8* pSrc = img.get_scanline(y);
                    const color_quad_u8* pSrc_end = pSrc + img.get_width();
                    uint8* pDst = &temp[y * img.get_width() * 3];

                    while (pSrc != pSrc_end)
                    {
                        const color_quad_u8 c(*pSrc++);

                        pDst[0] = c.r;
                        pDst[1] = c.g;
                        pDst[2] = c.b;

                        pDst += 3;
                    }
                }

                num_src_chans = 3;
                pSrc_img = &temp[0];
            }
            else
            {
                num_src_chans = 4;
                pSrc_img = img.get_ptr();
            }

            bool success = false;
            if (ext == "png")
            {
                size_t png_image_size = 0;
                void* pPNG_image_data = tdefl_write_image_to_png_file_in_memory(pSrc_img, img.get_width(), img.get_height(), num_src_chans, &png_image_size);
                if (!pPNG_image_data)
                {
                    return false;
                }
                success = file_utils::write_buf_to_file(pFilename, pPNG_image_data, png_image_size);
                mz_free(pPNG_image_data);
            }
            else if (is_jpeg)
            {
                jpge::params params;
                if (write_flags & cWriteFlagJPEGQualityLevelMask)
                {
                    params.m_quality = math::clamp<uint>((write_flags & cWriteFlagJPEGQualityLevelMask) >> cWriteFlagJPEGQualityLevelShift, 1U, 100U);
                }
                params.m_two_pass_flag = (write_flags & cWriteFlagJPEGTwoPass) != 0;
                params.m_no_chroma_discrim_flag = (write_flags & cWriteFlagJPEGNoChromaDiscrim) != 0;

                if (write_flags & cWriteFlagJPEGH1V1)
                {
                    params.m_subsampling = jpge::H1V1;
                }
                else if (write_flags & cWriteFlagJPEGH2V1)
                {
                    params.m_subsampling = jpge::H2V1;
                }
                else if (write_flags & cWriteFlagJPEGH2V2)
                {
                    params.m_subsampling = jpge::H2V2;
                }

                success = jpge::compress_image_to_jpeg_file(pFilename, img.get_width(), img.get_height(), num_src_chans, (const jpge::uint8*)pSrc_img, params);
            }
            else
            {
                success = ((ext == "bmp" ? stbi_write_bmp : stbi_write_tga)(pFilename, img.get_width(), img.get_height(), num_src_chans, pSrc_img) == CRNLIB_TRUE);
            }
            return success;
        }